

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O2

void runtimeError(char *format,...)

{
  long lVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar2;
  Precedence *pPVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  args[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 8;
  args[0].fp_offset = 0x30;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  vfprintf(_stderr,format,args);
  fputs("\n",_stderr);
  uVar2 = (ulong)(uint)vm.frameCount;
  pPVar3 = &rules[uVar2 + 0x27].precedence;
  for (; 0 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
    lVar1 = *(long *)(*(ParseFn *)(pPVar3 + -2) + 0x10);
    fprintf(_stderr,"[line %d] in ",
            (ulong)*(uint *)(~*(ulong *)(lVar1 + 0x20) * 4 + *(long *)(lVar1 + 0x28) +
                            *(long *)pPVar3 * 4));
    if (*(long *)(lVar1 + 0x40) == 0) {
      fwrite("script\n",7,1,_stderr);
    }
    else {
      fprintf(_stderr,"%s()\n",*(undefined8 *)(*(long *)(lVar1 + 0x40) + 0x18));
    }
    pPVar3 = pPVar3 + -6;
  }
  vm.stackTop = vm.stack;
  vm.openUpvalues = (ObjUpvalue *)0x0;
  return;
}

Assistant:

static void runtimeError(const char *format, ...) {
    va_list args;
    va_start(args, format);
    vfprintf(stderr, format, args);
    va_end(args);
    fputs("\n", stderr);

    for (int i = vm.frameCount - 1; i >= 0; i--) {
        CallFrame *frame = &vm.frames[i];
        ObjFunction *function = frame->closure->function;
        // -1 because the IP is sitting on the next instruction to be
        // executed.
        size_t instruction = frame->ip - function->chunk.code - 1;
        fprintf(stderr, "[line %d] in ",
                function->chunk.lines[instruction]);
        if (function->name == NULL) {
            fprintf(stderr, "script\n");
        } else {
            fprintf(stderr, "%s()\n", function->name->chars);
        }
    }

    resetStack();
}